

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GestDsk.cpp
# Opt level: O0

bool __thiscall
DSK::PutFileInDsk(DSK *this,string *Masque,int TypeModeImport,int loadAddress,int exeAddress,
                 int UserNumber,bool System_file,bool Read_only)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  FILE *__stream;
  bool local_79;
  StAmsdos *local_60;
  StAmsdos *e;
  bool IsAmsdos;
  FILE *Hfile;
  size_t sStack_40;
  bool ret;
  unsigned_long Lg;
  bool Read_only_local;
  bool System_file_local;
  int UserNumber_local;
  int exeAddress_local;
  int loadAddress_local;
  int TypeModeImport_local;
  string *Masque_local;
  DSK *this_local;
  
  pcVar3 = (char *)std::__cxx11::string::c_str();
  PutFileInDsk::cFileName = GetNomAmsdos(pcVar3);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  __stream = fopen(pcVar3,"rb");
  if (__stream == (FILE *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    sStack_40 = fread(PutFileInDsk::Buff,1,0x20000,__stream);
    fclose(__stream);
    local_79 = false;
    if (TypeModeImport != 2) {
      local_79 = CheckAmsdos(PutFileInDsk::Buff);
    }
    if ((loadAddress != 0) || (exeAddress_local = TypeModeImport, exeAddress != 0)) {
      exeAddress_local = 1;
    }
    if (exeAddress_local == 0) {
      if (local_79 != false) {
        memmove(PutFileInDsk::Buff,PutFileInDsk::Buff + 0x80,sStack_40 - 0x80);
        sStack_40 = sStack_40 - 0x80;
      }
    }
    else if (exeAddress_local == 1) {
      if (local_79 == false) {
        if (0xffff < sStack_40) {
          std::operator<<((ostream *)&std::cerr,
                          "Creating an header for files larger than 64K is not supported yet\n");
          return false;
        }
        std::operator<<((ostream *)&std::cout,"Automatically generating header for file\n");
        local_60 = CreeEnteteAmsdos(PutFileInDsk::cFileName,(unsigned_short)sStack_40);
        if (loadAddress != 0) {
          local_60->Adress = (unsigned_short)loadAddress;
        }
        if (exeAddress != 0) {
          local_60->EntryAdress = (unsigned_short)exeAddress;
        }
        SetChecksum(local_60);
        bVar1 = isBigEndian();
        if (bVar1) {
          local_60 = StAmsdosEndian(this,local_60);
        }
        memmove(PutFileInDsk::Buff + 0x80,PutFileInDsk::Buff,sStack_40);
        memcpy(PutFileInDsk::Buff,local_60,0x80);
        sStack_40 = sStack_40 + 0x80;
      }
      else {
        std::operator<<((ostream *)&std::cout,"File already has an header\n");
      }
    }
    else if (exeAddress_local == 2) {
      std::operator<<((ostream *)&std::cout,"Using raw mode, no header\n");
    }
    iVar2 = CopieFichier(this,PutFileInDsk::Buff,PutFileInDsk::cFileName,(int)sStack_40,0x100,
                         UserNumber,System_file,Read_only);
    this_local._7_1_ = iVar2 == 0;
  }
  return this_local._7_1_;
}

Assistant:

bool DSK::PutFileInDsk(string Masque, int TypeModeImport,
	int loadAddress, int exeAddress, int UserNumber,
	bool System_file, bool Read_only )
{
	static unsigned char Buff[0x20000];
	static char *cFileName;
	unsigned long Lg;
	bool ret;
	FILE* Hfile;

	// Get AMSDOS-formatted name
	cFileName = GetNomAmsdos(Masque.c_str());

	// Open and read the input file
	if ((Hfile = fopen(Masque.c_str(),"rb")) == NULL)
		return false;
	Lg=fread(Buff,1, 0x20000 ,Hfile);
	fclose( Hfile );

	// Check if file already has an header
	bool IsAmsdos = (TypeModeImport != MODE_RAW) &&  CheckAmsdos(Buff);

	// Force binary mode if a load or execution address is specified
	if (loadAddress != 0 || exeAddress != 0)
		TypeModeImport = MODE_BINAIRE;

	switch(TypeModeImport) {
		case MODE_ASCII:
			// In ASCII mode, delete the header if there is one
			if (IsAmsdos) {
				memmove(Buff, Buff + sizeof(StAmsdos), Lg - sizeof(StAmsdos));
				Lg -= sizeof(StAmsdos);
			}
		break;

		case MODE_BINAIRE :
			// In binary mode, add an header if there is none
			if ( ! IsAmsdos ) {
				// Sanity check on file size (we cast to unsigned short)
				if ( Lg >= 0x10000 ) {
					cerr << "Creating an header for files larger than 64K is not supported yet\n";
					return false;
				}
		
				// Create and fill AMSDOS header
				cout << "Automatically generating header for file\n";
				StAmsdos * e;
				e = CreeEnteteAmsdos(cFileName, (unsigned short)Lg);
				if (loadAddress != 0)
				{
					e->Adress = (unsigned short)loadAddress;
				}
				if (exeAddress != 0)
				{
					e->EntryAdress = (unsigned short)exeAddress;
				}
				// After changing addresses, recompute header checksum
				SetChecksum(e);
				// Fix endianness if run on big-endian machine
				if (isBigEndian()) e = StAmsdosEndian(e);

				// Insert the header before the file
				memmove(&Buff[sizeof(StAmsdos)], Buff, Lg);
				memcpy(Buff, e, sizeof(StAmsdos));
				Lg += sizeof(StAmsdos);
			}
			else
				cout << "File already has an header\n";
		break;
		case MODE_RAW :
			cout << "Using raw mode, no header\n";

	}

	// Copy the file inside the DSK image.
	if (CopieFichier(Buff, cFileName, Lg, 256, UserNumber, System_file, Read_only) != ERR_NO_ERR)
		ret = false;
	else
		ret = true;

	return ret;
}